

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
           *this,Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&> f)

{
  _func_shared_ptr<unsigned_short>_Boxed_Number_ptr *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::build_param_type_list<std::shared_ptr<unsigned_short>,chaiscript::Boxed_Number_const&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_003269d0;
  (this->m_f).m_func = f.m_func;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }